

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type)

{
  pointer *pppOVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  Option *pOVar4;
  iterator iVar5;
  pointer psVar6;
  pointer pbVar7;
  bool bVar8;
  type_conflict tVar9;
  int iVar10;
  int iVar11;
  Classifier CVar12;
  HorribleError *pHVar13;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var14;
  App *pAVar15;
  ArgumentMismatch *__return_storage_ptr__;
  pointer pbVar16;
  int num;
  pointer psVar17;
  int t;
  string rest;
  string arg_name;
  string value;
  string current;
  undefined1 local_2f8 [36];
  int local_2d4;
  _Head_base<0UL,_CLI::Option_*,_false> local_2d0;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_2c8;
  string local_2c0;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_2a0;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  anon_class_40_2_a297e68f_for__M_pred local_f8;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  pcVar3 = pbVar16[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,pcVar3 + pbVar16[-1]._M_string_length);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    bVar8 = detail::split_short(&local_258,&local_298,&local_2c0);
    if (!bVar8) {
      pHVar13 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar13,&local_90);
      __cxa_throw(pHVar13,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (current_type == WINDOWS) {
    bVar8 = detail::split_windows_style(&local_258,&local_298,&local_278);
    if (!bVar8) {
      pHVar13 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_b0._M_allocated_capacity = (size_type)&local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"windows option parsed but missing! You should not see this",""
                );
      HorribleError::HorribleError(pHVar13,(string *)&local_b0);
      __cxa_throw(pHVar13,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar13 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar13,&local_d0);
      __cxa_throw(pHVar13,&HorribleError::typeinfo,Error::~Error);
    }
    bVar8 = detail::split_long(&local_258,&local_298,&local_278);
    if (!bVar8) {
      pHVar13 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar13,&local_50);
      __cxa_throw(pHVar13,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var14._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar2 = &local_f8.arg_name.field_2;
  local_f8.arg_name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_298._M_dataplus._M_p,
             local_298._M_dataplus._M_p + local_298._M_string_length);
  local_f8.current_type = current_type;
  _Var14 = ::std::
           find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                     (_Var14,__last,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.arg_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.arg_name._M_dataplus._M_p);
  }
  if (_Var14._M_current ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar6 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar17 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar6;
        psVar17 = psVar17 + 1) {
      pAVar15 = (psVar17->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar15->name_)._M_string_length == 0) && (pAVar15->disabled_ == false)) &&
         (bVar8 = _parse_arg(pAVar15,args,current_type), bVar8)) {
        pAVar15 = (psVar17->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar8 = true;
        if (pAVar15->pre_parse_called_ == false) {
          _trigger_pre_parse(pAVar15,(long)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 5);
        }
        goto LAB_0011e98e;
      }
    }
    if (this->parent_ != (App *)0x0) {
      if (this->fallthrough_ == true) {
        pAVar15 = _get_fallthrough_parent(this);
        bVar8 = _parse_arg(pAVar15,args,current_type);
        goto LAB_0011e98e;
      }
      if ((this->name_)._M_string_length == 0) {
        bVar8 = false;
        goto LAB_0011e98e;
      }
    }
    pbVar16 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar16 + -1;
    pcVar3 = pbVar16[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar16[-1].field_2) {
      operator_delete(pcVar3);
    }
    bVar8 = true;
    _move_to_missing(this,current_type,&local_258);
    goto LAB_0011e98e;
  }
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pbVar16 + -1;
  pcVar3 = pbVar16[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &pbVar16[-1].field_2) {
    operator_delete(pcVar3);
  }
  pOVar4 = ((_Var14._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  iVar10 = pOVar4->type_size_min_;
  num = pOVar4->expected_min_ * iVar10;
  if (iVar10 <= num) {
    num = iVar10;
  }
  local_2f8._0_4_ = pOVar4->type_size_max_;
  tVar9 = detail::checked_multiply<int>((int *)local_2f8,pOVar4->expected_max_);
  local_2d4 = 0x20000000;
  if (tVar9) {
    local_2d4 = local_2f8._0_4_;
  }
  if (local_2d4 == 0) {
    pOVar4 = ((_Var14._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    Option::get_flag_value((string *)local_2f8,pOVar4,&local_298,&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    pOVar4 = ((_Var14._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_2f8._0_8_,(pointer)(local_2f8._0_8_ + local_2f8._8_8_));
    Option::_add_result(pOVar4,&local_198,&pOVar4->results_);
    pOVar4->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    local_2d0._M_head_impl =
         ((_Var14._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar5._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar5,
                 &local_2d0._M_head_impl);
    }
    else {
      *iVar5._M_current = local_2d0._M_head_impl;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    if ((Option *)local_2f8._0_8_ != (Option *)(local_2f8 + 0x10)) {
      operator_delete((void *)local_2f8._0_8_);
    }
LAB_0011e473:
    iVar10 = 0;
  }
  else if (local_278._M_string_length == 0) {
    if ((char *)local_2c0._M_string_length == (char *)0x0) goto LAB_0011e473;
    pOVar4 = ((_Var14._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_2c0._M_dataplus._M_p,
               local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
    iVar10 = Option::_add_result(pOVar4,&local_1d8,&pOVar4->results_);
    pOVar4->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_2f8._0_8_ =
         ((_Var14._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar5._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar5,
                 (Option **)local_2f8);
    }
    else {
      *iVar5._M_current = (Option *)local_2f8._0_8_;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_2c0,0,(char *)local_2c0._M_string_length,0x142aa3);
  }
  else {
    pOVar4 = ((_Var14._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    iVar10 = Option::_add_result(pOVar4,&local_1b8,&pOVar4->results_);
    pOVar4->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    local_2f8._0_8_ =
         ((_Var14._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar5._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar5,
                 (Option **)local_2f8);
    }
    else {
      *iVar5._M_current = (Option *)local_2f8._0_8_;
      pppOVar1 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
  }
  if (iVar10 < num) {
    local_2c8 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    do {
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar16) {
        __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_118,
                   ((_Var14._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        Option::get_type_name_abi_cxx11_
                  (&local_70,
                   ((_Var14._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        ArgumentMismatch::TypedAtLeast(__return_storage_ptr__,&local_118,num,&local_70);
        __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      local_2f8._0_8_ = local_2f8 + 0x10;
      pcVar3 = pbVar16[-1]._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f8,pcVar3,pcVar3 + pbVar16[-1]._M_string_length);
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar16 + -1;
      pcVar3 = pbVar16[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar16[-1].field_2) {
        operator_delete(pcVar3);
      }
      pOVar4 = ((_Var14._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_2f8._0_8_,(pointer)(local_2f8._0_8_ + local_2f8._8_8_));
      iVar11 = Option::_add_result(pOVar4,&local_1f8,&pOVar4->results_);
      pOVar4->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      local_2d0._M_head_impl =
           ((_Var14._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar5._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  (local_2c8,iVar5,&local_2d0._M_head_impl);
      }
      else {
        *iVar5._M_current = local_2d0._M_head_impl;
        pppOVar1 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
      if ((Option *)local_2f8._0_8_ != (Option *)(local_2f8 + 0x10)) {
        operator_delete((void *)local_2f8._0_8_);
      }
      iVar10 = iVar10 + iVar11;
    } while (iVar10 < num);
  }
  if ((iVar10 < local_2d4) ||
     ((((_Var14._M_current)->_M_t).
       super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
    local_2c8 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)
                _count_remaining_positionals(this,true);
    local_2a0 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    while ((iVar10 < local_2d4 ||
           ((((_Var14._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != false))
          ) {
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar16 == pbVar7) goto LAB_0011e773;
      CVar12 = _recognize(this,pbVar7 + -1,false);
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((CVar12 != NONE) ||
         (pbVar7 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
         (vector<CLI::Option*,std::allocator<CLI::Option*>> *)((long)pbVar7 - (long)pbVar16 >> 5) <=
         local_2c8)) goto LAB_0011e773;
      pOVar4 = ((_Var14._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      pcVar3 = pbVar7[-1]._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar3,pcVar3 + pbVar7[-1]._M_string_length);
      iVar11 = Option::_add_result(pOVar4,&local_238,&pOVar4->results_);
      pOVar4->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      local_2f8._0_8_ =
           ((_Var14._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar5._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  (local_2a0,iVar5,(Option **)local_2f8);
      }
      else {
        *iVar5._M_current = (Option *)local_2f8._0_8_;
        pppOVar1 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar16 + -1;
      pcVar3 = pbVar16[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar16[-1].field_2) {
        operator_delete(pcVar3);
      }
      iVar10 = iVar10 + iVar11;
    }
    pbVar16 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
LAB_0011e773:
    iVar11 = local_2d4;
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((pbVar16 != pbVar7) &&
       (CVar12 = _recognize(this,pbVar7 + -1,true), CVar12 == POSITIONAL_MARK)) {
      pbVar16 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar16 + -1;
      pcVar3 = pbVar16[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar16[-1].field_2) {
        operator_delete(pcVar3);
      }
    }
    if ((0 < iVar11) && (iVar10 == 0 && num == 0)) {
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      Option::get_flag_value
                ((string *)local_2f8,
                 ((_Var14._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_298,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      pOVar4 = ((_Var14._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_2f8._0_8_,(pointer)(local_2f8._0_8_ + local_2f8._8_8_));
      Option::_add_result(pOVar4,&local_218,&pOVar4->results_);
      pOVar4->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      local_2d0._M_head_impl =
           ((_Var14._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar5._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  (local_2a0,iVar5,&local_2d0._M_head_impl);
      }
      else {
        *iVar5._M_current = local_2d0._M_head_impl;
        pppOVar1 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
      if ((Option *)local_2f8._0_8_ != (Option *)(local_2f8 + 0x10)) {
        operator_delete((void *)local_2f8._0_8_);
      }
    }
  }
  if (0 < num) {
    pOVar4 = ((_Var14._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((pOVar4->type_size_max_ != num) && (iVar10 % pOVar4->type_size_max_ != 0)) {
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      Option::_add_result(pOVar4,&local_158,&pOVar4->results_);
      pOVar4->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
    }
  }
  bVar8 = true;
  if ((char *)local_2c0._M_string_length != (char *)0x0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     "-",&local_2c0);
    ::std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_2f8);
    if ((Option *)local_2f8._0_8_ != (Option *)(local_2f8 + 0x10)) {
      operator_delete((void *)local_2f8._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&local_2c0);
  }
LAB_0011e98e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool _parse_arg(std::vector<std::string> &args, detail::Classifier current_type) {

        std::string current = args.back();

        std::string arg_name;
        std::string value;
        std::string rest;

        switch(current_type) {
        case detail::Classifier::LONG:
            if(!detail::split_long(current, arg_name, value))
                throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
            break;
        case detail::Classifier::SHORT:
            if(!detail::split_short(current, arg_name, rest))
                throw HorribleError("Short parsed but missing! You should not see this");
            break;
        case detail::Classifier::WINDOWS:
            if(!detail::split_windows_style(current, arg_name, value))
                throw HorribleError("windows option parsed but missing! You should not see this");
            break;
        case detail::Classifier::SUBCOMMAND:
        case detail::Classifier::SUBCOMMAND_TERMINATOR:
        case detail::Classifier::POSITIONAL_MARK:
        case detail::Classifier::NONE:
        default:
            throw HorribleError("parsing got called with invalid option! You should not see this");
        }

        auto op_ptr =
            std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
                if(current_type == detail::Classifier::LONG)
                    return opt->check_lname(arg_name);
                if(current_type == detail::Classifier::SHORT)
                    return opt->check_sname(arg_name);
                // this will only get called for detail::Classifier::WINDOWS
                return opt->check_lname(arg_name) || opt->check_sname(arg_name);
            });

        // Option not found
        if(op_ptr == std::end(options_)) {
            for(auto &subc : subcommands_) {
                if(subc->name_.empty() && !subc->disabled_) {
                    if(subc->_parse_arg(args, current_type)) {
                        if(!subc->pre_parse_called_) {
                            subc->_trigger_pre_parse(args.size());
                        }
                        return true;
                    }
                }
            }
            // If a subcommand, try the master command
            if(parent_ != nullptr && fallthrough_)
                return _get_fallthrough_parent()->_parse_arg(args, current_type);
            // don't capture missing if this is a nameless subcommand
            if(parent_ != nullptr && name_.empty()) {
                return false;
            }
            // Otherwise, add to missing
            args.pop_back();
            _move_to_missing(current_type, current);
            return true;
        }

        args.pop_back();

        // Get a reference to the pointer to make syntax bearable
        Option_p &op = *op_ptr;

        int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
        int max_num = op->get_items_expected_max();

        // Make sure we always eat the minimum for unlimited vectors
        int collected = 0;     // total number of arguments collected
        int result_count = 0;  // local variable for number of results in a single arg string
        // deal with purely flag like things
        if(max_num == 0) {
            auto res = op->get_flag_value(arg_name, value);
            op->add_result(res);
            parse_order_.push_back(op.get());
        } else if(!value.empty()) {  // --this=value
            op->add_result(value, result_count);
            parse_order_.push_back(op.get());
            collected += result_count;
            // -Trest
        } else if(!rest.empty()) {
            op->add_result(rest, result_count);
            parse_order_.push_back(op.get());
            rest = "";
            collected += result_count;
        }

        // gather the minimum number of arguments
        while(min_num > collected && !args.empty()) {
            std::string current_ = args.back();
            args.pop_back();
            op->add_result(current_, result_count);
            parse_order_.push_back(op.get());
            collected += result_count;
        }

        if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
            throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
        }

        if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
            auto remreqpos = _count_remaining_positionals(true);
            // we have met the minimum now optionally check up to the maximum
            while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
                  _recognize(args.back(), false) == detail::Classifier::NONE) {
                // If any required positionals remain, don't keep eating
                if(remreqpos >= args.size()) {
                    break;
                }

                op->add_result(args.back(), result_count);
                parse_order_.push_back(op.get());
                args.pop_back();
                collected += result_count;
            }

            // Allow -- to end an unlimited list and "eat" it
            if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
                args.pop_back();
            // optional flag that didn't receive anything now get the default value
            if(min_num == 0 && max_num > 0 && collected == 0) {
                auto res = op->get_flag_value(arg_name, std::string{});
                op->add_result(res);
                parse_order_.push_back(op.get());
            }
        }

        // if we only partially completed a type then add an empty string for later processing
        if(min_num > 0 && op->get_type_size_max() != min_num && collected % op->get_type_size_max() != 0) {
            op->add_result(std::string{});
        }

        if(!rest.empty()) {
            rest = "-" + rest;
            args.push_back(rest);
        }
        return true;
    }